

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

ostream * __thiscall wasm::String::printEscaped(String *this,ostream *os,string_view str)

{
  ostream oVar1;
  ostream *this_00;
  void *this_01;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_33,1);
  if (os != (ostream *)0x0) {
    poVar5 = (ostream *)0x0;
    do {
      oVar1 = poVar5[str._M_len];
      if ((byte)oVar1 < 0x22) {
        if (oVar1 == (ostream)0x9) {
          lVar3 = 2;
          pcVar4 = "\\t";
          goto LAB_00c3efce;
        }
        if (oVar1 == (ostream)0xa) {
          lVar3 = 2;
          pcVar4 = "\\n";
          goto LAB_00c3efce;
        }
        if ((byte)oVar1 == 0xd) {
          lVar3 = 2;
          pcVar4 = "\\r";
          goto LAB_00c3efce;
        }
LAB_00c3ef95:
        if ((byte)((char)oVar1 - 0x20U) < 0x5f) {
          lVar3 = 1;
          pcVar4 = &local_31;
          goto LAB_00c3efce;
        }
        *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
             *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 8;
        this_00 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_32,1);
        this_01 = (void *)std::ostream::operator<<(this_00,(uint)((byte)oVar1 >> 4));
        plVar2 = (long *)std::ostream::operator<<(this_01,(byte)oVar1 & 0xf);
        *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) =
             *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      }
      else {
        if (oVar1 == (ostream)0x22) {
          lVar3 = 2;
          pcVar4 = "\\\"";
        }
        else if (oVar1 == (ostream)0x27) {
          lVar3 = 2;
          pcVar4 = "\\\'";
        }
        else {
          if (oVar1 != (ostream)0x5c) goto LAB_00c3ef95;
          lVar3 = 2;
          pcVar4 = "\\\\";
        }
LAB_00c3efce:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,pcVar4,lVar3);
      }
      poVar5 = poVar5 + 1;
    } while (os != poVar5);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_34,1);
  return poVar5;
}

Assistant:

std::ostream& printEscaped(std::ostream& os, std::string_view str) {
  os << '"';
  for (unsigned char c : str) {
    switch (c) {
      case '\t':
        os << "\\t";
        break;
      case '\n':
        os << "\\n";
        break;
      case '\r':
        os << "\\r";
        break;
      case '"':
        os << "\\\"";
        break;
      case '\'':
        os << "\\'";
        break;
      case '\\':
        os << "\\\\";
        break;
      default: {
        if (c >= 32 && c < 127) {
          os << c;
        } else {
          os << std::hex << '\\' << (c / 16) << (c % 16) << std::dec;
        }
      }
    }
  }
  return os << '"';
}